

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedForward.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  char *pcVar11;
  undefined **ppuVar12;
  long lVar13;
  char **__argv;
  FILE *__stream;
  char *__src;
  stat fs2;
  char self_path [4096];
  char msgbuf [4096];
  char exe [4096];
  char build_path_real [4096];
  char self_path_real [4096];
  
  bVar10 = false;
  pcVar8 = *argv;
  for (pcVar5 = pcVar8; (!bVar10 && (cVar2 = *pcVar5, cVar2 != '\0')); pcVar5 = pcVar5 + 1) {
    bVar10 = cVar2 == '\\' || cVar2 == '/';
  }
  if (bVar10) {
    uVar6 = strlen(pcVar8);
    uVar9 = 0xffffffffffffffff;
    while( true ) {
      iVar4 = (int)uVar9;
      if ((pcVar8 + uVar6 < pcVar8) || (-1 < iVar4)) break;
      cVar2 = pcVar8[uVar6];
      if ((cVar2 == '\\') || (cVar2 == '/')) {
        uVar9 = uVar6 & 0xffffffff;
      }
      uVar6 = uVar6 - 1;
    }
    if (iVar4 < 0) {
      self_path[0] = '.';
      self_path[1] = '\0';
    }
    else if (iVar4 == 0) {
      self_path[0] = '/';
      self_path[1] = '\0';
    }
    else {
      strncpy(self_path,pcVar8,uVar9 & 0xffffffff);
      self_path[uVar9 & 0xffffffff] = '\0';
    }
  }
  else {
    pcVar5 = getenv("PATH");
    if (pcVar5 == (char *)0x0) {
      sVar7 = 0;
    }
    else {
      sVar7 = strlen(pcVar5);
    }
    pcVar11 = pcVar5 + sVar7;
    iVar4 = 1;
    do {
      do {
        if (pcVar5 == pcVar11) {
          pcVar8 = *argv;
          pcVar5 = "Error locating executable \"%s\".\n";
          __stream = _stderr;
          goto LAB_00101669;
        }
        __src = pcVar5 + -1;
        do {
          cVar2 = __src[1];
          __src = __src + 1;
        } while (cVar2 == ':');
        sVar7 = 0;
        pcVar5 = __src;
        while ((cVar2 != '\0' && (cVar2 != ':'))) {
          pcVar1 = pcVar5 + 1;
          pcVar5 = pcVar5 + 1;
          sVar7 = sVar7 + 1;
          cVar2 = *pcVar1;
        }
      } while (pcVar5 <= __src);
      if ((pcVar5[-1] == '/') || (pcVar5[-1] == '\\')) {
        sVar7 = sVar7 - 1;
      }
      strncpy(self_path,__src,sVar7);
      self_path[sVar7] = '/';
      strcpy(self_path + sVar7 + 1,pcVar8);
      iVar3 = access(self_path,1);
    } while (iVar3 != 0);
    self_path[sVar7] = '\0';
  }
  iVar4 = kwsys_shared_forward_realpath(self_path,self_path_real);
  if (iVar4 == 0) {
    kwsys_shared_forward_strerror(msgbuf);
    fprintf(_stderr,"Error converting self path \"%s\" to real path: %s\n",self_path,msgbuf);
  }
  else {
    iVar4 = kwsys_shared_forward_realpath
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/build_O2/Source/kwsys"
                       ,build_path_real);
    if (((((iVar4 == 0) || (iVar4 = stat(self_path_real,(stat *)msgbuf), iVar4 != 0)) ||
         (iVar4 = stat(build_path_real,(stat *)&fs2), iVar4 != 0)) ||
        ((fs2.st_dev != msgbuf._0_8_ || (fs2.st_ino != msgbuf._8_8_)))) ||
       (fs2.st_size != msgbuf._48_8_)) {
      ppuVar12 = (undefined **)&kwsys_shared_forward_get_settings_search_path_install;
    }
    else {
      ppuVar12 = &kwsys_shared_forward_get_settings_search_path_build;
    }
    lVar13 = 0;
    do {
      pcVar8 = *(char **)((long)ppuVar12 + lVar13);
      if (pcVar8 == (char *)0x0) {
        iVar4 = kwsys_shared_forward_fullpath(self_path,"cmsysTestProcess",exe,"executable file");
        if (iVar4 == 0) {
          return 1;
        }
        pcVar8 = getenv("LD_LIBRARY_PATH");
        if (pcVar8 != (char *)0x0) {
          sVar7 = strlen(kwsys_shared_forward_ldpath);
          (kwsys_shared_forward_ldpath + sVar7)[0] = ':';
          (kwsys_shared_forward_ldpath + sVar7)[1] = '\0';
          strcat(kwsys_shared_forward_ldpath,pcVar8);
        }
        putenv(kwsys_shared_forward_ldpath);
        __argv = argv;
        if (1 < argc) {
          pcVar8 = argv[1];
          iVar4 = strcmp(pcVar8,"--command");
          if (iVar4 == 0) {
            if (argc == 2) {
              fwrite("Option --command must be followed by a command line.\n",0x35,1,_stderr);
              return 1;
            }
            __argv = argv + 2;
            strcpy(exe,argv[2]);
            if ((uint)argc < 4) goto LAB_001015b7;
            pcVar8 = argv[3];
          }
          iVar4 = strcmp(pcVar8,"--print");
          if (iVar4 == 0) {
            iVar4 = 0;
            fprintf(_stdout,"%s\n",kwsys_shared_forward_ldpath);
            pcVar8 = exe;
            pcVar5 = "%s\n";
            __stream = _stdout;
LAB_00101669:
            fprintf(__stream,pcVar5,pcVar8);
            return iVar4;
          }
          iVar4 = strcmp(pcVar8,"--ldd");
          if (iVar4 == 0) {
            __argv = (char **)build_path_real;
            build_path_real._0_8_ = (long)"--ldd" + 2;
            build_path_real[0x10] = '\0';
            build_path_real[0x11] = '\0';
            build_path_real[0x12] = '\0';
            build_path_real[0x13] = '\0';
            build_path_real[0x14] = '\0';
            build_path_real[0x15] = '\0';
            build_path_real[0x16] = '\0';
            build_path_real[0x17] = '\0';
            build_path_real._8_8_ = exe;
            execvp("ldd",__argv);
            goto LAB_001015c8;
          }
        }
LAB_001015b7:
        *__argv = exe;
        execvp(exe,__argv);
LAB_001015c8:
        kwsys_shared_forward_print_failure(__argv);
        return 1;
      }
      if (lVar13 != 0) {
        sVar7 = strlen(kwsys_shared_forward_ldpath);
        (kwsys_shared_forward_ldpath + sVar7)[0] = ':';
        (kwsys_shared_forward_ldpath + sVar7)[1] = '\0';
      }
      sVar7 = strlen(kwsys_shared_forward_ldpath);
      iVar4 = kwsys_shared_forward_fullpath
                        (self_path,pcVar8,kwsys_shared_forward_ldpath + sVar7,"runtime path entry");
      lVar13 = lVar13 + 8;
    } while (iVar4 != 0);
  }
  return 1;
}

Assistant:

int main(int argc, char** argv)
{
  return cmsys_shared_forward_to_real(argc, argv);
}